

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  element_type *peVar2;
  TestCaseInfo *in_stack_fffffffffffffeb8;
  allocator *paVar3;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffec0;
  XmlFormatting fmt;
  string *in_stack_fffffffffffffec8;
  XmlWriter *in_stack_fffffffffffffed0;
  string *str;
  string local_100 [16];
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  XmlWriter *in_stack_ffffffffffffff20;
  TestCaseInfo *in_stack_ffffffffffffff28;
  SourceLineInfo *in_stack_ffffffffffffff38;
  XmlReporter *in_stack_ffffffffffffff40;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [39];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase<Catch::XmlReporter>::testCaseStarting
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"TestCase",&local_31);
  operator|(Newline,Indent);
  XmlWriter::startElement(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,fmt);
  str = (string *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"name",(allocator *)str);
  trim(str);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  paVar3 = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"description",paVar3);
  this_00 = XmlWriter::writeAttribute
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                      );
  paVar3 = (allocator *)&stack0xffffffffffffff27;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff28,"tags",paVar3);
  TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_ffffffffffffff28);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  writeSourceInfo(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15615e);
  iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    Timer::start((Timer *)this_00);
  }
  XmlWriter::ensureTagClosed(this_00);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }